

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_diff.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  undefined8 uVar9;
  string *psVar10;
  ostream *poVar11;
  reference pbVar12;
  string err;
  string s;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  long k;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it_2;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  iterator it_1;
  iterator it;
  bool ids_different;
  bool records_different;
  string master_id;
  long state_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  updated_sequences;
  anon_class_8_1_65350a3f echo_fasta_sequence;
  long output;
  long master_sequences;
  long duplicates;
  long sequences_to_add_count;
  string check_existing;
  long current_size;
  long state;
  bool sequence_deduplication;
  long non_unique_ids;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sequences_to_add;
  char automatonState;
  long firstSequenceLength;
  args_t args;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffa54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  undefined4 uVar15;
  int in_stack_fffffffffffffa6c;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  char *in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa87;
  key_type *in_stack_fffffffffffffa88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa90;
  string local_310 [32];
  _Self local_2f0;
  _Self local_2e8;
  undefined1 *local_2e0;
  long local_2d8;
  undefined1 in_stack_fffffffffffffd3f;
  double in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd4f;
  Vector *in_stack_fffffffffffffd50;
  Vector *in_stack_fffffffffffffd58;
  StringBuffer *in_stack_fffffffffffffd60;
  StringBuffer *in_stack_fffffffffffffd68;
  _Self in_stack_fffffffffffffd70;
  _Self in_stack_fffffffffffffd78;
  allocator local_275;
  int local_274;
  iterator in_stack_fffffffffffffd90;
  allocator local_261;
  Vector *in_stack_fffffffffffffda0;
  char in_stack_fffffffffffffda8;
  _Self local_240;
  allocator local_231;
  string local_230 [32];
  _Self local_210;
  _Self local_208;
  byte local_1fb;
  byte local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  long local_1d8;
  undefined1 local_1d0 [24];
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  size_type local_198;
  undefined1 local_18c;
  allocator local_18b;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  size_type local_d0;
  allocator local_c1;
  string local_c0 [32];
  long local_a0;
  undefined1 local_93;
  allocator local_92;
  byte local_91;
  long local_90;
  undefined1 local_41;
  undefined8 local_40 [3];
  FILE *local_28;
  int local_20;
  int local_1c;
  byte local_18;
  int local_4;
  
  local_4 = 0;
  argparse::args_t::args_t
            ((args_t *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,
             (char **)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  local_40[0] = 1;
  local_41 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10981e);
  initAlphabets((bool)in_stack_fffffffffffffa87,in_stack_fffffffffffffa78,
                (bool)in_stack_fffffffffffffa77);
  local_90 = 0;
  local_91 = 0;
  if (local_1c == 2) {
    if (local_20 != 2) {
      local_93 = 1;
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (psVar10,"sequence matching mode MUST also use the remove operation",&local_92);
      local_93 = 0;
      __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    local_91 = 1;
  }
  do {
    uVar15 = 0;
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar13 = 1;
    iVar4 = readFASTA((FILE *)in_stack_fffffffffffffd78._M_node,
                      (char *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                      (long *)in_stack_fffffffffffffd90._M_node,(bool)in_stack_fffffffffffffd4f,
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffda8,in_stack_fffffffffffffd40,
                      (bool)in_stack_fffffffffffffd3f);
    local_a0 = (long)iVar4;
    if (local_a0 == 0) break;
    if ((local_a0 != 2) && (local_a0 != 3)) {
      local_18c = 1;
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar10,"Error reading FASTA file",&local_18b);
      local_18c = 0;
      __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if ((local_91 & 1) == 0) {
      local_d0 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)0x109b00);
      pcVar5 = StringBuffer::getString(&names);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,pcVar5,&local_111);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::string(local_f0,(string *)pmVar7);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      pcVar5 = StringBuffer::getString(&sequences);
      pcVar6 = StringBuffer::getString(&names);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,pcVar6,&local_139);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::operator=((string *)pmVar7,pcVar5);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      sVar1 = local_d0;
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x109c6f);
      if (sVar1 == sVar8) {
        pcVar5 = StringBuffer::getString(&names);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_160,pcVar5,&local_161);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffa6c,uVar15));
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        if (!_Var2) {
          local_18a = 1;
          uVar9 = __cxa_allocate_exception(0x20);
          pcVar5 = StringBuffer::getString(&names);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_188,pcVar5,&local_189);
          std::operator+(pbVar14,(char *)CONCAT44(in_stack_fffffffffffffa54,uVar13));
          local_18a = 0;
          __cxa_throw(uVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        local_90 = local_90 + 1;
      }
      std::__cxx11::string::~string(local_f0);
    }
    else {
      pcVar5 = StringBuffer::getString(&names);
      pcVar6 = StringBuffer::getString(&sequences);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar6,&local_c1);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::operator=((string *)pmVar7,pcVar5);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  } while (local_a0 != 3);
  local_198 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x10a064);
  local_1a0 = 0;
  local_1a8 = 0;
  local_1b0 = 0;
  local_1b8 = &local_1b0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10a0ad);
  do {
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
    uVar15 = 0x3a;
    __p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0;
    uVar13 = 1;
    iVar4 = readFASTA((FILE *)in_stack_fffffffffffffd78._M_node,
                      (char *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                      (long *)in_stack_fffffffffffffd90._M_node,(bool)in_stack_fffffffffffffd4f,
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffda8,in_stack_fffffffffffffd40,
                      (bool)in_stack_fffffffffffffd3f);
    local_1d8 = (long)iVar4;
    if (local_1d8 == 0) break;
    if ((local_1d8 != 2) && (local_1d8 != 3)) {
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar10,"Error reading FASTA file",&local_275);
      __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pcVar5 = StringBuffer::getString(&names);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,pcVar5,&local_1f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    local_1a8 = local_1a8 + 1;
    if ((local_91 & 1) == 0) {
      local_208._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)pbVar14,(key_type *)0x10a1e2);
      local_210._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pbVar14);
      local_1fb = std::operator==(&local_208,&local_210);
      if ((bool)local_1fb) {
        local_1fa = 1;
      }
      else if (local_1c == 1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x10a2b9);
        pcVar5 = StringBuffer::getString(&sequences);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_230,pcVar5,&local_231);
        local_1fa = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffa54,uVar13),pbVar14);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
      }
      else {
        local_1fa = 0;
      }
    }
    else {
      local_1fb = 1;
      pcVar5 = StringBuffer::getString(&sequences);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffda0,pcVar5,&local_261);
      local_240._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)pbVar14,(key_type *)0x10a3e5);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      in_stack_fffffffffffffd90 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pbVar14);
      local_1fa = std::operator==(&local_240,(_Self *)&stack0xfffffffffffffd90);
    }
    if ((local_1fa & 1) == 0) {
      local_1a0 = local_1a0 + 1;
      if (local_20 != 1) {
        if (local_20 == 0) {
          std::__cxx11::string::c_str();
          StringBuffer::getString(&sequences);
          main::anon_class_8_1_65350a3f::operator()
                    ((anon_class_8_1_65350a3f *)CONCAT44(in_stack_fffffffffffffa64,uVar15),
                     (char *)__p,(char *)CONCAT44(in_stack_fffffffffffffa54,uVar13),(FILE *)pbVar14)
          ;
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa54,uVar13),pbVar14);
        goto LAB_0010a61c;
      }
      if (local_1d8 == 3) {
        local_274 = 5;
      }
      else {
        local_274 = 4;
      }
    }
    else {
      if (((local_1fb & 1) != 0) || (local_20 != 1)) {
        if (((local_1fb & 1) == 0) &&
           (std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa64,uVar15),&__p->first), local_20 == 0))
        {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa54,uVar13),pbVar14);
        }
        std::__cxx11::string::c_str();
        StringBuffer::getString(&sequences);
        main::anon_class_8_1_65350a3f::operator()
                  ((anon_class_8_1_65350a3f *)CONCAT44(in_stack_fffffffffffffa64,uVar15),(char *)__p
                   ,(char *)CONCAT44(in_stack_fffffffffffffa54,uVar13),(FILE *)pbVar14);
      }
LAB_0010a61c:
      if (local_1d8 == 3) {
        local_274 = 5;
      }
      else {
        local_274 = 0;
      }
    }
    std::__cxx11::string::~string(local_1f8);
  } while ((local_274 == 0) || (local_274 == 4));
  if (local_20 != 2) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)pbVar14);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)pbVar14);
    while (bVar3 = std::operator!=((_Self *)&stack0xfffffffffffffd78,
                                   (_Self *)&stack0xfffffffffffffd70), bVar3) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x10a7c2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa64,uVar15),__p);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      main::anon_class_8_1_65350a3f::operator()
                ((anon_class_8_1_65350a3f *)CONCAT44(in_stack_fffffffffffffa64,uVar15),(char *)__p,
                 (char *)CONCAT44(in_stack_fffffffffffffa54,uVar13),(FILE *)pbVar14);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffa54,uVar13));
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa54,uVar13));
    }
  }
  funlockfile(local_28);
  if ((local_18 & 1) == 0) {
    poVar11 = (ostream *)
              std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>)
    ;
    poVar11 = std::operator<<(poVar11,"{");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"\'master\' :");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1a8);
    poVar11 = std::operator<<(poVar11,',');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"\'fasta\'  : ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_198);
    poVar11 = std::operator<<(poVar11,',');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"\'output\' : ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1b0);
    poVar11 = std::operator<<(poVar11,',');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"\'non-unqiue\' : ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_90);
    poVar11 = std::operator<<(poVar11,',');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"\'duplicate\' : ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1a0);
    poVar11 = std::operator<<(poVar11,',');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar11,"\'updated_sequences\' : [");
    local_2d8 = 0;
    local_2e0 = local_1d0;
    local_2e8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar14);
    local_2f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pbVar14);
    while (bVar3 = std::operator!=(&local_2e8,&local_2f0), bVar3) {
      pbVar12 = std::
                _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x10ab9b);
      std::__cxx11::string::string(local_310,(string *)pbVar12);
      if (local_2d8 != 0) {
        std::operator<<((ostream *)&std::cerr,", ");
      }
      poVar11 = std::operator<<((ostream *)&std::cerr,"\'");
      poVar11 = std::operator<<(poVar11,local_310);
      std::operator<<(poVar11,"\'");
      local_2d8 = local_2d8 + 1;
      std::__cxx11::string::~string(local_310);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_2e8);
    }
    poVar11 = std::operator<<((ostream *)&std::cerr,"]");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<(poVar11,"}");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x10acda);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10ace7);
  local_4 = 0;
  local_274 = 1;
  argparse::args_t::~args_t((args_t *)CONCAT44(in_stack_fffffffffffffa54,uVar13));
  return local_4;
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    
    long firstSequenceLength = 1L;
    
    try {
        char automatonState = 0;
        // 0 - between sequences
        // 1 - reading sequence name
        // 2 - reading sequence
        
        std::map<std::string, std::string> sequences_to_add;
        
        /*auto compare_records = [&] (const std::string & id1, const char* seq_value) -> int {
            std::map<std::string, std::string>::iterator it = sequences_to_add.find (id1);
            if (it !=  sequences_to_add.end()) {
                if (args.checks == id) {
                    return 1;
                }
                return it->second == std::string (seq_value) ? 2 : 3;
            }
            return 0;
        };*/
        


        initAlphabets(false, NULL, true);
        long non_unique_ids = 0;
        bool sequence_deduplication = false;
      
      if (args.checks == argparse::sequence) {
        if (args.op == argparse::remove) {
          sequence_deduplication = true;
        } else {
          throw (std::string ("sequence matching mode MUST also use the remove operation"));
        }
      }
      

        while (long state = readFASTA(args.input_add, automatonState, names, sequences, nameLengths,
                         seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            if (state == 2 || state == 3) {
                if (sequence_deduplication) {
                  // for this run mode, the map is inverted : sequence  -->  ID
                  sequences_to_add[sequences.getString()] = names.getString();
                } else {
                  long current_size = sequences_to_add.size();
                  std::string check_existing = sequences_to_add[names.getString()];
                  sequences_to_add[names.getString()] = sequences.getString();
                  if (current_size == sequences_to_add.size()) {
                      if (check_existing == sequences_to_add[names.getString()]) {
                          //cerr << std::string (names.getString()) + " is not a unique sequence ID in the master file" << endl;
                          non_unique_ids++;
                      } else {
                          throw (std::string (names.getString()) + " is not a unique sequence ID in the master file and different instances of this name have different sequences");
                      }
                  }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
            //dump_fasta (sequences.getString(), firstSequenceLength, stdout);
        }
        
        long sequences_to_add_count = sequences_to_add.size(),
             duplicates = 0L,
             master_sequences = 0L,
             output = 0L;

        auto echo_fasta_sequence = [&] (const char* id, const char* data, FILE * where) -> void {
            output ++;
            fprintf (where, ">%s\n%s\n", id, data);
        };


        /*
         scan master records one by one;
         output those that are not present in sequences_to_add
         those that are present in sequences_to_add will be
        */
        
        std::list <std::string> updated_sequences;
        
        while (long state = readFASTA(args.input_master, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true)) {
            if (state == 2 || state == 3) {
                std::string master_id (names.getString());
                //cerr << master_id << endl;
                master_sequences++;
              
                bool records_different,
                     ids_different;
                if (!sequence_deduplication) {
                  auto it = sequences_to_add.find (master_id);
                  ids_different = it == sequences_to_add.end();
                  
                  if (ids_different) {
                      records_different = true;
                  } else {
                      if (args.checks == argparse::id_and_sequence) {
                          records_different = it->second != std::string (sequences.getString());
                      } else {
                          records_different = false;
                      }
                  }
                } else {
                  ids_different = true;
                  auto it = sequences_to_add.find (sequences.getString());
                  records_different = it == sequences_to_add.end();
                }
                
                //cout << records_different << " " << ids_different << endl;
                
                if (!records_different) { // not unique
                    duplicates++;
                    if (args.op == argparse::replace) {
                        if (state == 3) {
                            break;
                        }
                        continue;
                    }
                    if (args.op == argparse::add) {
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                    sequences_to_add.erase (master_id);
                } else {
                    if (ids_different || args.op != argparse::replace) {
                        if (!ids_different) {
                            updated_sequences.push_back (master_id);
                            if (args.op == argparse::add) {
                                sequences_to_add.erase (master_id);
                            }
                        }
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
        }
                
                // now output remaining sequences from the FASTA file
        
        if (args.op != argparse::remove) {
            for (std::pair<std::string, std::string> it : sequences_to_add) {
                echo_fasta_sequence (it.first.c_str(), it.second.c_str(), args.output);
            }
        }
        funlockfile (args.output);

        if (!args.quiet) {
            cerr << endl << "{" << endl << "'master' :" << master_sequences << ',' << endl <<
                      "'fasta'  : " << sequences_to_add_count << ',' << endl <<
                      "'output' : " << output << ',' << endl <<
                      "'non-unqiue' : " << non_unique_ids << ',' << endl <<
                      "'duplicate' : " << duplicates << ',' << endl <<
                      "'updated_sequences' : [";
            
            long k = 0;
            for (std::string s : updated_sequences) {
                if (k) {
                    cerr << ", ";
                }
                cerr << "'" << s << "'";
                k++;
            }
            cerr << "]" << endl << "}" << endl;
        }
        
        /*
        if (!args.quiet) {
            cerr << "Read " << sequences_to_add.size() << " sequences from the FASTA file" << endl;
        }*/

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}